

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  bufq *q;
  void *pvVar1;
  curl_trc_feat *pcVar2;
  void *pvVar3;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  undefined8 *puVar4;
  byte bVar5;
  _Bool _Var6;
  uint uVar7;
  CURLcode CVar8;
  uint err;
  uint uVar9;
  int iVar10;
  CURLcode CVar11;
  BIO_METHOD *type;
  BIO *pBVar12;
  ulong uVar13;
  ssl_config_data *psVar14;
  long lVar15;
  char *pcVar16;
  SSL_CIPHER *c;
  char *pcVar17;
  int *piVar18;
  uchar **ppuVar19;
  char *pcVar20;
  bool bVar21;
  bool bVar22;
  size_t blen;
  char *local_198;
  size_t nwritten;
  uchar *buf;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uchar *neg_protocol;
  uchar auStack_130 [256];
  
  pvVar1 = cf->ctx;
  if (*(int *)((long)pvVar1 + 0xb8) == 3) {
    _Var6 = true;
    CVar11 = CURLE_OK;
    goto LAB_00173ce4;
  }
  *done = false;
  *(undefined4 *)((long)pvVar1 + 0xc4) = 0;
  if (*(int *)((long)pvVar1 + 0xbc) == 0) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_001732bd;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_001732bd:
        if (0 < cf->cft->log_level) {
          Curl_trc_cf_infof(data,cf,"ossl_connect, step1");
        }
      }
    }
    pvVar3 = cf->ctx;
    octx = *(ossl_ctx **)((long)pvVar3 + 0x40);
    CVar8 = Curl_ossl_ctx_init(octx,cf,data,(ssl_peer *)((long)pvVar3 + 8),
                               *(alpn_spec **)((long)pvVar3 + 0x38),(Curl_ossl_ctx_setup_cb *)0x0,
                               (void *)0x0,ossl_new_session_cb,cf,ossl_on_session_reuse);
    if (CVar8 == CURLE_OK) {
      type = (BIO_METHOD *)BIO_meth_new(0x401,"OpenSSL CF BIO");
      if (type == (BIO_METHOD *)0x0) {
        octx->bio_method = (BIO_METHOD *)0x0;
      }
      else {
        BIO_meth_set_write(type,ossl_bio_cf_out_write);
        BIO_meth_set_read(type,ossl_bio_cf_in_read);
        BIO_meth_set_ctrl(type,ossl_bio_cf_ctrl);
        BIO_meth_set_create(type,ossl_bio_cf_create);
        BIO_meth_set_destroy(type,ossl_bio_cf_destroy);
        octx->bio_method = (BIO_METHOD *)type;
        pBVar12 = BIO_new(type);
        if (pBVar12 != (BIO *)0x0) {
          BIO_set_data(pBVar12,cf);
          BIO_up_ref(pBVar12);
          SSL_set0_rbio(octx->ssl,pBVar12);
          SSL_set0_wbio(octx->ssl,pBVar12);
          if ((*(alpn_spec **)((long)pvVar3 + 0x38) != (alpn_spec *)0x0) &&
             (*(int *)((long)pvVar3 + 0xb8) != 1)) {
            auStack_130[8] = '\0';
            auStack_130[9] = '\0';
            auStack_130[10] = '\0';
            auStack_130[0xb] = '\0';
            auStack_130[0xc] = '\0';
            auStack_130[0xd] = '\0';
            auStack_130[0xe] = '\0';
            auStack_130[0xf] = '\0';
            auStack_130[0x10] = '\0';
            auStack_130[0x11] = '\0';
            auStack_130[0x12] = '\0';
            auStack_130[0x13] = '\0';
            auStack_130[0x14] = '\0';
            auStack_130[0x15] = '\0';
            auStack_130[0x16] = '\0';
            auStack_130[0x17] = '\0';
            neg_protocol = (uchar *)0x0;
            auStack_130[0] = '\0';
            auStack_130[1] = '\0';
            auStack_130[2] = '\0';
            auStack_130[3] = '\0';
            auStack_130[4] = '\0';
            auStack_130[5] = '\0';
            auStack_130[6] = '\0';
            auStack_130[7] = '\0';
            auStack_130._24_8_ = 0;
            Curl_alpn_to_proto_str
                      ((alpn_proto_buf *)&neg_protocol,*(alpn_spec **)((long)pvVar3 + 0x38));
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              Curl_infof(data,"ALPN: curl offers %s",&neg_protocol);
            }
          }
          *(undefined4 *)((long)pvVar3 + 0xbc) = 1;
          CVar8 = CURLE_OK;
          goto LAB_00173468;
        }
      }
      CVar8 = CURLE_OUT_OF_MEMORY;
    }
LAB_00173468:
    if (CVar8 == CURLE_OK) goto LAB_001730a7;
  }
  else {
LAB_001730a7:
    if (*(int *)((long)pvVar1 + 0xbc) == 1) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00173125;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00173125:
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"ossl_connect, step2");
          }
        }
      }
      if (*(int *)((long)pvVar1 + 0xc0) == 1) {
        CVar8 = CURLE_OK;
        goto LAB_00173cc4;
      }
      if (*(int *)((long)pvVar1 + 0xc0) == 2) {
        pvVar3 = cf->ctx;
        lVar15 = *(long *)((long)pvVar3 + 0x40);
        *(undefined4 *)(lVar15 + 0x20) = 0;
        q = (bufq *)((long)pvVar3 + 0x68);
        _Var6 = Curl_bufq_peek(q,&buf,&blen);
        if (_Var6) {
LAB_0017319d:
          nwritten = 0;
          uVar7 = SSL_write_early_data
                            (*(undefined8 *)(lVar15 + 8),buf,CONCAT44(blen._4_4_,(uint)blen));
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
            pcVar2 = (data->state).feat;
            if (pcVar2 == (curl_trc_feat *)0x0) {
              if (cf != (Curl_cfilter *)0x0) goto LAB_001731f1;
            }
            else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_001731f1:
              if (0 < cf->cft->log_level) {
                Curl_trc_cf_infof(data,cf,"SSL_write_early_data(len=%zu) -> %d, %zu",
                                  CONCAT44(blen._4_4_,(uint)blen),(ulong)uVar7,nwritten);
              }
            }
          }
          if (0 < (int)uVar7) goto code_r0x0017322a;
          iVar10 = SSL_get_error(*(SSL **)(lVar15 + 8),uVar7);
          switch(iVar10) {
          case 0:
            pcVar16 = "SSL_ERROR_NONE";
            break;
          case 1:
            uVar13 = ERR_get_error();
            pcVar16 = ossl_strerror(uVar13,(char *)&neg_protocol,0x100);
            Curl_failf(data,"SSL_write_early_data() error: %s",pcVar16);
            goto LAB_001735c5;
          case 2:
            *(undefined4 *)((long)pvVar3 + 0xc4) = 1;
            goto LAB_001734f9;
          case 3:
            *(undefined4 *)((long)pvVar3 + 0xc4) = 2;
LAB_001734f9:
            CVar8 = CURLE_AGAIN;
            goto LAB_001735d0;
          case 4:
            pcVar16 = "SSL_ERROR_WANT_X509_LOOKUP";
            break;
          case 5:
            piVar18 = __errno_location();
            CVar8 = CURLE_AGAIN;
            if (*(int *)(lVar15 + 0x20) != 0x51) {
              iVar10 = *piVar18;
              uVar13 = ERR_get_error();
              if (uVar13 == 0) {
                if (iVar10 == 0) {
                  curl_msnprintf((char *)&neg_protocol,0x100,"%s","SSL_ERROR_SYSCALL");
                }
                else {
                  Curl_strerror(iVar10,(char *)&neg_protocol,0x100);
                }
              }
              else {
                ossl_strerror(uVar13,(char *)&neg_protocol,0x100);
              }
              pcVar20 = "OpenSSL SSL_write:early_data: %s, errno %d";
              pcVar16 = (char *)&neg_protocol;
              goto LAB_001735be;
            }
            goto LAB_001735d0;
          case 6:
            pcVar16 = "SSL_ERROR_ZERO_RETURN";
            break;
          case 7:
            pcVar16 = "SSL_ERROR_WANT_CONNECT";
            break;
          case 8:
            pcVar16 = "SSL_ERROR_WANT_ACCEPT";
            break;
          case 9:
            pcVar16 = "SSL_ERROR_WANT_ASYNC";
            break;
          case 10:
            pcVar16 = "SSL_ERROR_WANT_ASYNC_JOB";
            break;
          default:
            pcVar16 = "SSL_ERROR unknown";
          }
          __errno_location();
          pcVar20 = "OpenSSL SSL_write_early_data: %s, errno %d";
LAB_001735be:
          Curl_failf(data,pcVar20,pcVar16);
LAB_001735c5:
          CVar8 = CURLE_SEND_ERROR;
          goto LAB_001735d0;
        }
LAB_00173251:
        CVar8 = CURLE_OK;
        if (((data != (Curl_easy *)0x0) && (CVar8 = CURLE_OK, ((data->set).field_0x89f & 0x40) != 0)
            ) && ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar2->log_level)))) {
          CVar8 = CURLE_OK;
          Curl_infof(data,"SSL sending %zu bytes of early data",*(undefined8 *)((long)pvVar3 + 0xb0)
                    );
        }
LAB_001735d0:
        if (CVar8 != CURLE_OK) goto LAB_00173cc4;
        *(undefined4 *)((long)pvVar1 + 0xc0) = 3;
      }
      connssl = (ssl_connect_data *)cf->ctx;
      puVar4 = (undefined8 *)connssl->backend;
      psVar14 = Curl_ssl_cf_get_config(cf,data);
      connssl->io_need = 0;
      ERR_clear_error();
      uVar7 = SSL_connect((SSL *)puVar4[1]);
      if ((*(byte *)((long)puVar4 + 0x24) & 1) == 0) {
        CVar8 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar4);
        if (CVar8 == CURLE_OK) {
          *(byte *)((long)puVar4 + 0x24) = *(byte *)((long)puVar4 + 0x24) | 1;
          goto LAB_00173644;
        }
      }
      else {
LAB_00173644:
        if (uVar7 == 1) {
          buf = (uchar *)((ulong)buf & 0xffffffff00000000);
          connssl->connecting_state = ssl_connect_3;
          SSL_get_peer_signature_type_nid(puVar4[1]);
          CVar8 = CURLE_OK;
          lVar15 = SSL_ctrl((SSL *)puVar4[1],0x86,0,(void *)0x0);
          pcVar16 = OBJ_nid2sn((uint)lVar15 & 0xffff);
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
              (0 < pcVar2->log_level)))) {
            local_198 = SSL_get_version((SSL *)puVar4[1]);
            c = SSL_get_current_cipher((SSL *)puVar4[1]);
            pcVar17 = SSL_CIPHER_get_name(c);
            pcVar20 = "[blank]";
            if (pcVar16 != (char *)0x0) {
              pcVar20 = pcVar16;
            }
            pcVar16 = OBJ_nid2sn((int)buf);
            Curl_infof(data,"SSL connection using %s / %s / %s / %s",local_198,pcVar17,pcVar20,
                       pcVar16);
          }
          if (connssl->alpn != (alpn_spec *)0x0) {
            SSL_get0_alpn_selected(puVar4[1],&neg_protocol,&blen);
            CVar8 = Curl_alpn_set_negotiated(cf,data,connssl,neg_protocol,(ulong)(uint)blen);
          }
        }
        else {
          err = SSL_get_error((SSL *)puVar4[1],uVar7);
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
            pcVar2 = (data->state).feat;
            if (pcVar2 == (curl_trc_feat *)0x0) {
              if (cf != (Curl_cfilter *)0x0) goto LAB_001737a3;
            }
            else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_001737a3:
              if (0 < cf->cft->log_level) {
                Curl_trc_cf_infof(data,cf,"SSL_connect() -> err=%d, detail=%d",(ulong)uVar7,
                                  (ulong)err);
              }
            }
          }
          if ((int)err < 9) {
            if (err == 2) {
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
                pcVar2 = (data->state).feat;
                if (pcVar2 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_00173b33;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00173b33:
                  if (0 < cf->cft->log_level) {
                    pcVar16 = "SSL_connect() -> want recv";
LAB_00173b67:
                    Curl_trc_cf_infof(data,cf,pcVar16);
                  }
                }
              }
              goto LAB_00173b76;
            }
            if (err != 3) {
LAB_00173884:
              memset(&neg_protocol,0,0x100);
              connssl->connecting_state = ssl_connect_2;
              local_198 = (char *)ERR_get_error();
              uVar9 = (uint)local_198;
              bVar22 = (int)uVar9 < 0;
              uVar7 = 0x7fffffff;
              if (!bVar22) {
                uVar7 = 0x7fffff;
              }
              uVar7 = uVar7 & uVar9;
              bVar21 = (uVar9 & 0xff800000) != 0xa000000;
              if ((bVar21 || bVar22) || ((uVar7 != 0x415 && (uVar7 != 0x86)))) {
                pcVar16 = ossl_strerror((unsigned_long)local_198,(char *)&neg_protocol,0x100);
                if ((bVar21 || bVar22) || uVar7 != 0x45c) {
                  Curl_failf(data,"TLS connect error: %s",pcVar16);
                  CVar8 = CURLE_SSL_CONNECT_ERROR;
                  bVar5 = 1;
                }
                else {
                  bVar5 = 0;
                  Curl_failf(data,"TLS cert problem: %s",pcVar16);
                  CVar8 = CURLE_SSL_CLIENTCERT;
                }
              }
              else {
                lVar15 = SSL_get_verify_result((SSL *)puVar4[1]);
                if (lVar15 == 0) {
                  pcVar20 = "%s";
                  pcVar16 = "SSL certificate verification failed";
                }
                else {
                  psVar14->certverifyresult = lVar15;
                  pcVar16 = X509_verify_cert_error_string(lVar15);
                  pcVar20 = "SSL certificate problem: %s";
                }
                bVar5 = 0;
                Curl_failf(data,pcVar20,pcVar16);
                CVar8 = CURLE_PEER_FAILED_VERIFICATION;
              }
              if (!(bool)(bVar5 ^ 1 | local_198 != (char *)0x0)) {
                local_148 = 0;
                uStack_140 = 0;
                local_158 = 0;
                uStack_150 = 0;
                local_168 = 0;
                uStack_160 = 0;
                local_178 = 0;
                uStack_170 = 0;
                buf = (uchar *)0x0;
                uStack_180 = 0;
                piVar18 = __errno_location();
                if ((*piVar18 != 0) && (err == 5)) {
                  Curl_strerror(*piVar18,(char *)&buf,0x50);
                }
                if ((char)buf == '\0') {
                  ppuVar19 = (uchar **)SSL_ERROR_to_str(err);
                }
                else {
                  ppuVar19 = &buf;
                }
                Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",ppuVar19,
                           (connssl->peer).hostname,(ulong)(uint)(connssl->peer).port);
              }
              goto LAB_00173b86;
            }
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
              pcVar2 = (data->state).feat;
              if (pcVar2 == (curl_trc_feat *)0x0) {
                if (cf != (Curl_cfilter *)0x0) goto LAB_00173adc;
              }
              else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00173adc:
                if (0 < cf->cft->log_level) {
                  Curl_trc_cf_infof(data,cf,"SSL_connect() -> want send");
                }
              }
            }
            connssl->io_need = 2;
          }
          else {
            if (err == 9) {
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
                pcVar2 = (data->state).feat;
                if (pcVar2 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_00173b52;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00173b52:
                  if (0 < cf->cft->log_level) {
                    pcVar16 = "SSL_connect() -> want async";
                    goto LAB_00173b67;
                  }
                }
              }
            }
            else {
              if (err != 0xc) goto LAB_00173884;
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
                pcVar2 = (data->state).feat;
                if (pcVar2 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_00173b14;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00173b14:
                  if (0 < cf->cft->log_level) {
                    pcVar16 = "SSL_connect() -> want retry_verify";
                    goto LAB_00173b67;
                  }
                }
              }
            }
LAB_00173b76:
            connssl->io_need = 1;
          }
          CVar8 = CURLE_AGAIN;
        }
      }
LAB_00173b86:
      if (CVar8 != CURLE_OK) goto LAB_00173cc4;
    }
    if (*(int *)((long)pvVar1 + 0xbc) == 2) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00173bd4;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00173bd4:
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"ossl_connect, step3");
          }
        }
      }
      pvVar3 = cf->ctx;
      CVar8 = Curl_oss_check_peer_cert
                        (cf,data,*(ossl_ctx **)((long)pvVar3 + 0x40),(ssl_peer *)((long)pvVar3 + 8))
      ;
      if (CVar8 != CURLE_OK) {
        Curl_ssl_scache_remove_all(cf,data,*(char **)((long)pvVar3 + 0x20));
        goto LAB_00173cc4;
      }
      *(undefined4 *)((long)pvVar1 + 0xbc) = 3;
      if (*(int *)((long)pvVar1 + 0xc0) != 0) {
        iVar10 = SSL_get_early_data_status(*(undefined8 *)(*(long *)((long)pvVar1 + 0x40) + 8));
        *(uint *)((long)pvVar1 + 0xc0) = iVar10 == 2 ^ 5;
      }
    }
    CVar8 = CURLE_OK;
    if (*(int *)((long)pvVar1 + 0xbc) == 3) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_00173c9b;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00173c9b:
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"ossl_connect, done");
          }
        }
      }
      *(undefined4 *)((long)pvVar1 + 0xb8) = 3;
    }
  }
LAB_00173cc4:
  _Var6 = false;
  CVar11 = CURLE_OK;
  if (CVar8 != CURLE_AGAIN) {
    _Var6 = (*(uint *)((long)pvVar1 + 0xb8) & 0xfffffffd) == 1;
    CVar11 = CVar8;
  }
LAB_00173ce4:
  *done = _Var6;
  return CVar11;
code_r0x0017322a:
  Curl_bufq_skip(q,nwritten);
  _Var6 = Curl_bufq_peek(q,&buf,&blen);
  if (!_Var6) goto LAB_00173251;
  goto LAB_0017319d;
}

Assistant:

static CURLcode ossl_connect(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  connssl->io_need = CURL_SSL_IO_NEED_NONE;

  if(ssl_connect_1 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step1");
    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_2 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step2");
#ifdef HAVE_OPENSSL_EARLYDATA
    if(connssl->earlydata_state == ssl_earlydata_await) {
      goto out;
    }
    else if(connssl->earlydata_state == ssl_earlydata_sending) {
      result = ossl_send_earlydata(cf, data);
      if(result)
        goto out;
      connssl->earlydata_state = ssl_earlydata_sent;
    }
#endif
    DEBUGASSERT((connssl->earlydata_state == ssl_earlydata_none) ||
                (connssl->earlydata_state == ssl_earlydata_sent));

    result = ossl_connect_step2(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_3 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step3");
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
    connssl->connecting_state = ssl_connect_done;
#ifdef HAVE_OPENSSL_EARLYDATA
    if(connssl->earlydata_state > ssl_earlydata_none) {
      struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
      /* We should be in this state by now */
      DEBUGASSERT(connssl->earlydata_state == ssl_earlydata_sent);
      connssl->earlydata_state =
        (SSL_get_early_data_status(octx->ssl) == SSL_EARLY_DATA_ACCEPTED) ?
        ssl_earlydata_accepted : ssl_earlydata_rejected;
    }
#endif
  }

  if(ssl_connect_done == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, done");
    connssl->state = ssl_connection_complete;
  }

out:
  if(result == CURLE_AGAIN) {
    *done = FALSE;
    return CURLE_OK;
  }
  *done = ((connssl->state == ssl_connection_complete) ||
           (connssl->state == ssl_connection_deferred));
  return result;
}